

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

void __thiscall
Fl_Menu_Item::draw(Fl_Menu_Item *this,int x,int y,int w,int h,Fl_Menu_ *m,int selected)

{
  uint uVar1;
  Fl_Color FVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  Fl_Color FVar5;
  _func_int **pp_Var6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Fl_Color FVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int w_00;
  uint uVar15;
  int iVar16;
  Fl_Label local_60;
  
  local_60.value = this->text;
  local_60.image = (Fl_Image *)0x0;
  local_60.deimage = (Fl_Image *)0x0;
  local_60.type = this->labeltype_;
  local_60.font = this->labelfont_;
  local_60.size = this->labelsize_;
  if (local_60.font == 0 && local_60.size == 0) {
    if (m == (Fl_Menu_ *)0x0) {
      local_60.font = 0;
    }
    else {
      local_60.font = m->textfont_;
    }
  }
  if ((local_60.size == 0) && (local_60.size = FL_NORMAL_SIZE, m != (Fl_Menu_ *)0x0)) {
    local_60.size = m->textsize_;
  }
  local_60.color = this->labelcolor_;
  if (local_60.color == 0) {
    if (m == (Fl_Menu_ *)0x0) {
      local_60.color = 0;
    }
    else {
      local_60.color = m->textcolor_;
    }
  }
  if ((this->flags & 1) != 0) {
    local_60.color = fl_inactive(local_60.color);
  }
  if (m == (Fl_Menu_ *)0x0) {
    FVar5 = 0x31;
  }
  else {
    FVar5 = (m->super_Fl_Widget).color_;
  }
  if (selected != 0) {
    if (m == (Fl_Menu_ *)0x0) {
      FVar10 = 0xf;
      FVar4 = FL_FLAT_BOX;
    }
    else {
      FVar10 = (m->super_Fl_Widget).color2_;
      FVar4 = (Fl_Boxtype)(byte)(m->down_box_ + (m->down_box_ == '\0'));
    }
    FVar2 = fl_contrast(FVar10,FVar5);
    if (FVar2 == FVar10) {
      local_60.color = fl_contrast(this->labelcolor_,FVar10);
    }
    else if (selected == 2) {
      FVar10 = FVar5;
      if (m == (Fl_Menu_ *)0x0) {
        FVar4 = FL_UP_BOX;
      }
      else {
        FVar4 = (Fl_Boxtype)(m->super_Fl_Widget).box_;
      }
    }
    else {
      FVar10 = 0x37;
      local_60.color = fl_contrast(this->labelcolor_,0x37);
    }
    if (selected == 2) {
      fl_draw_box(FVar4,x,y,w,h,FVar10);
      x = x + 3;
      w = w + -8;
    }
    else {
      fl_draw_box(FVar4,x + 1,y + -1,w + -2,h + 2,FVar10);
    }
  }
  if ((this->flags & 10U) == 0) goto LAB_001bddcd;
  uVar7 = ((h - FL_NORMAL_SIZE) - ((h - FL_NORMAL_SIZE) + 1 >> 0x1f)) + 1;
  iVar11 = (int)uVar7 >> 1;
  w_00 = h - (uVar7 & 0xfffffffe);
  if ((this->flags & 8U) == 0) {
    fl_draw_box(FL_DOWN_BOX,x + 2,y + iVar11,w_00,w_00,7);
    if ((this->flags & 4) != 0) {
      if ((Fl::scheme_ == (char *)0x0) || (iVar3 = strcmp("gtk+",Fl::scheme_), iVar3 != 0)) {
        uVar12 = (ulong)this->labelcolor_;
      }
      else {
        uVar12 = 0xf;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar12);
      iVar3 = (w_00 + -6) / 3;
      iVar8 = (((w_00 + -6) - iVar3) + w_00) / 2;
      uVar7 = x + 5 + iVar3;
      iVar16 = 0;
      do {
        uVar1 = y + iVar8 + iVar11 + -2 + iVar16;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)(x + 5),
                   (ulong)(uint)(((y + iVar11) - iVar3) + iVar8 + -2 + iVar16),(ulong)uVar7,
                   (ulong)uVar1);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)uVar7,(ulong)uVar1,(ulong)((x + w_00) - 2),
                   (ulong)(uint)(iVar16 + ((iVar11 * 3 + iVar3 + y + iVar8) - h) + 5));
        iVar16 = iVar16 + 1;
      } while (iVar16 != 3);
    }
  }
  else {
    FVar4 = fl_define_FL_ROUND_UP_BOX();
    iVar11 = iVar11 + y;
    fl_draw_box(FVar4 + FL_FLAT_BOX,x + 2,iVar11,w_00,w_00,7);
    if ((this->flags & 4) != 0) {
      FVar4 = fl_define_FL_ROUND_UP_BOX();
      iVar3 = Fl::box_dw(FVar4 + FL_FLAT_BOX);
      iVar3 = (w_00 - iVar3) / 2;
      uVar7 = iVar3 + 1;
      uVar1 = iVar3 + 2;
      if ((h - uVar7 & 1) == 0) {
        uVar1 = uVar7;
      }
      iVar3 = (int)(w_00 - uVar1) / 2;
      if ((Fl::scheme_ == (char *)0x0) || (iVar8 = strcmp("gtk+",Fl::scheme_), iVar8 != 0)) {
        uVar7 = this->labelcolor_;
        uVar15 = uVar1;
      }
      else {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0xf);
        uVar15 = uVar1 - 1;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,0x4076800000000000,fl_graphics_driver,(ulong)(x + iVar3 + 1),
                   (ulong)((iVar3 + iVar11) - 1),(ulong)(uVar1 + 2),(ulong)(uVar1 + 2));
        uVar7 = fl_color_average(0xff,0xf,0.2);
      }
      uVar12 = (ulong)uVar15;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar7);
      if (uVar15 - 3 < 3) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                  (fl_graphics_driver,(ulong)(iVar3 + x + 3),(ulong)(uint)(iVar3 + iVar11),
                   (ulong)(uVar15 - 2),uVar12);
        uVar13 = (ulong)(iVar3 + x + 2);
        uVar9 = (ulong)(uint)(iVar3 + 1 + iVar11);
        pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        uVar14 = (ulong)(uVar15 - 2);
LAB_001bdd30:
        (*pp_Var6[4])(fl_graphics_driver,uVar13,uVar9,uVar12,uVar14);
      }
      else {
        if (uVar15 - 1 < 2) {
          uVar13 = (ulong)(x + iVar3 + 2);
          uVar9 = (ulong)(uint)(iVar3 + iVar11);
          pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          uVar14 = uVar12;
          goto LAB_001bdd30;
        }
        if (uVar15 == 6) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(iVar3 + x + 4),(ulong)(uint)(iVar3 + iVar11),2,6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(iVar3 + x + 3),(ulong)(uint)(iVar3 + 1 + iVar11),4,4
                    );
          uVar13 = (ulong)(iVar3 + x + 2);
          uVar9 = (ulong)(uint)(iVar3 + 2 + iVar11);
          pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          uVar12 = 6;
          uVar14 = 2;
          goto LAB_001bdd30;
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,0x4076800000000000,fl_graphics_driver,(ulong)(x + iVar3 + 2),
                   (ulong)(uint)(iVar3 + iVar11),uVar12,uVar12);
      }
      if ((Fl::scheme_ != (char *)0x0) && (iVar8 = strcmp("gtk+",Fl::scheme_), iVar8 == 0)) {
        FVar5 = fl_color_average(0xff,0xf,0.5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar5);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0,0x4066800000000000,fl_graphics_driver,(ulong)(x + iVar3 + 2),
                   (ulong)(uint)(iVar11 + iVar3),(ulong)(uVar15 + 1),(ulong)(uVar15 + 1));
      }
    }
  }
  x = x + w_00 + 3;
  w = w - (w_00 + 3);
LAB_001bddcd:
  if (fl_draw_shortcut == '\0') {
    fl_draw_shortcut = '\x01';
  }
  iVar11 = 0;
  if (6 < w) {
    iVar11 = w + -6;
  }
  Fl_Label::draw(&local_60,x + 3,y,iVar11,h,4);
  fl_draw_shortcut = '\0';
  return;
}

Assistant:

void Fl_Menu_Item::draw(int x, int y, int w, int h, const Fl_Menu_* m,
			int selected) const {
  Fl_Label l;
  l.value   = text;
  l.image   = 0;
  l.deimage = 0;
  l.type    = labeltype_;
  l.font    = labelsize_ || labelfont_ ? labelfont_ : (m ? m->textfont() : FL_HELVETICA);
  l.size    = labelsize_ ? labelsize_ : m ? m->textsize() : FL_NORMAL_SIZE;
  l.color   = labelcolor_ ? labelcolor_ : m ? m->textcolor() : int(FL_FOREGROUND_COLOR);
  if (!active()) l.color = fl_inactive((Fl_Color)l.color);
  Fl_Color color = m ? m->color() : FL_GRAY;
  if (selected) {
    Fl_Color r = m ? m->selection_color() : FL_SELECTION_COLOR;
    Fl_Boxtype b = m && m->down_box() ? m->down_box() : FL_FLAT_BOX;
    if (fl_contrast(r,color)!=r) { // back compatibility boxtypes
      if (selected == 2) { // menu title
	r = color;
	b = m ? m->box() : FL_UP_BOX;
      } else {
	r = (Fl_Color)(FL_COLOR_CUBE-1); // white
	l.color = fl_contrast((Fl_Color)labelcolor_, r);
      }
    } else {
      l.color = fl_contrast((Fl_Color)labelcolor_, r);
    }
    if (selected == 2) { // menu title
      fl_draw_box(b, x, y, w, h, r);
      x += 3;
      w -= 8;
    } else {
      fl_draw_box(b, x+1, y-(LEADING-2)/2, w-2, h+(LEADING-2), r);
    }
  }

  if (flags & (FL_MENU_TOGGLE|FL_MENU_RADIO)) {
    int d = (h - FL_NORMAL_SIZE + 1) / 2;
    int W = h - 2 * d;

    if (flags & FL_MENU_RADIO) {
      fl_draw_box(FL_ROUND_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	int tW = (W - Fl::box_dw(FL_ROUND_DOWN_BOX)) / 2 + 1;
	if ((W - tW) & 1) tW++;	// Make sure difference is even to center
	int td = (W - tW) / 2;
        if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	  tW --;
	  fl_pie(x + td + 1, y + d + td - 1, tW + 3, tW + 3, 0.0, 360.0);
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	} else fl_color(labelcolor_);

	switch (tW) {
	  // Larger circles draw fine...
	  default :
            fl_pie(x + td + 2, y + d + td, tW, tW, 0.0, 360.0);
	    break;

          // Small circles don't draw well on many systems...
	  case 6 :
	    fl_rectf(x + td + 4, y + d + td, tW - 4, tW);
	    fl_rectf(x + td + 3, y + d + td + 1, tW - 2, tW - 2);
	    fl_rectf(x + td + 2, y + d + td + 2, tW, tW - 4);
	    break;

	  case 5 :
	  case 4 :
	  case 3 :
	    fl_rectf(x + td + 3, y + d + td, tW - 2, tW);
	    fl_rectf(x + td + 2, y + d + td + 1, tW, tW - 2);
	    break;

	  case 2 :
	  case 1 :
	    fl_rectf(x + td + 2, y + d + td, tW, tW);
	    break;
	}

	if (Fl::is_scheme("gtk+")) {
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	  fl_arc(x + td + 2, y + d + td, tW + 1, tW + 1, 60.0, 180.0);
	}
      }
    } else {
      fl_draw_box(FL_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	} else {
	  fl_color(labelcolor_);
	}
	int tx = x + 5;
	int tw = W - 6;
	int d1 = tw/3;
	int d2 = tw-d1;
	int ty = y + d + (W+d2)/2-d1-2;
	for (int n = 0; n < 3; n++, ty++) {
	  fl_line(tx, ty, tx+d1, ty+d1);
	  fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	}
      }
    }
    x += W + 3;
    w -= W + 3;
  }

  if (!fl_draw_shortcut) fl_draw_shortcut = 1;
  l.draw(x+3, y, w>6 ? w-6 : 0, h, FL_ALIGN_LEFT);
  fl_draw_shortcut = 0;
}